

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Regexp * __thiscall re2::Regexp::ParseState::DoFinish(ParseState *this)

{
  RegexpStatus *pRVar1;
  Regexp *re;
  ParseState *this_00;
  
  this_00 = this;
  DoAlternation(this);
  re = this->stacktop_;
  if ((re == (Regexp *)0x0) || (re->down_ == (Regexp *)0x0)) {
    this->stacktop_ = (Regexp *)0x0;
    FinishRegexp(this_00,re);
  }
  else {
    pRVar1 = this->status_;
    pRVar1->code_ = kRegexpMissingParen;
    (pRVar1->error_arg_).ptr_ = (this->whole_regexp_).ptr_;
    (pRVar1->error_arg_).length_ = (this->whole_regexp_).length_;
    re = (Regexp *)0x0;
  }
  return re;
}

Assistant:

Regexp* Regexp::ParseState::DoFinish() {
  DoAlternation();
  Regexp* re = stacktop_;
  if (re != NULL && re->down_ != NULL) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return NULL;
  }
  stacktop_ = NULL;
  return FinishRegexp(re);
}